

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LoadPropertySymAsArgument(Lowerer *this,Instr *instr,Opnd *fieldSrc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  PropertySym *pPVar5;
  IntConstOpnd *opndArg;
  Instr *pIVar6;
  RegOpnd *opndArg_00;
  RegOpnd *instanceOpnd;
  IntConstOpnd *indexOpnd;
  PropertySym *fieldSym;
  SymOpnd *symOpnd;
  Instr *instrPrev;
  Opnd *fieldSrc_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar2 = IR::Opnd::IsSymOpnd(fieldSrc);
  if (bVar2) {
    pSVar4 = IR::Opnd::AsSymOpnd(fieldSrc);
    bVar2 = Sym::IsPropertySym(pSVar4->m_sym);
    if (bVar2) goto LAB_007bc8ec;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1608,
                     "(fieldSrc->IsSymOpnd() && fieldSrc->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected fieldSym as src of LdFld");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_007bc8ec:
  pSVar4 = IR::Opnd::AsSymOpnd(fieldSrc);
  pPVar5 = Sym::AsPropertySym(pSVar4->m_sym);
  opndArg = IR::IntConstOpnd::New((long)pPVar5->m_propertyId,TyInt32,this->m_func,true);
  pIVar6 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  opndArg_00 = IR::SymOpnd::CreatePropertyOwnerOpnd(pSVar4,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg_00->super_Opnd);
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LoadPropertySymAsArgument(IR::Instr *instr, IR::Opnd *fieldSrc)
{
    IR::Instr * instrPrev;
    AssertMsg(fieldSrc->IsSymOpnd() && fieldSrc->AsSymOpnd()->m_sym->IsPropertySym(), "Expected fieldSym as src of LdFld");

    IR::SymOpnd *symOpnd = fieldSrc->AsSymOpnd();
    PropertySym * fieldSym = symOpnd->m_sym->AsPropertySym();

    IR::IntConstOpnd * indexOpnd = IR::IntConstOpnd::New(fieldSym->m_propertyId, TyInt32, m_func, /*dontEncode*/true);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::RegOpnd * instanceOpnd = symOpnd->CreatePropertyOwnerOpnd(m_func);
    m_lowererMD.LoadHelperArgument(instr, instanceOpnd);

    return instrPrev;
}